

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary.cpp
# Opt level: O1

DiagnosticStream * __thiscall
anon_unknown.dwarf_6ba7a4::Parser::diagnostic
          (DiagnosticStream *__return_storage_ptr__,Parser *this,spv_result_t error)

{
  size_t sVar1;
  MessageConsumer *consumer;
  spv_position_t position;
  string local_48;
  
  sVar1 = (this->_).instruction_count;
  consumer = this->consumer_;
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"");
  position.index = sVar1;
  position.line = 0;
  position.column = 0;
  spvtools::DiagnosticStream::DiagnosticStream
            (__return_storage_ptr__,position,consumer,&local_48,error);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

spvtools::DiagnosticStream diagnostic(spv_result_t error) {
    return spvtools::DiagnosticStream({0, 0, _.instruction_count}, consumer_,
                                      "", error);
  }